

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

string * chooseMap_abi_cxx11_(void)

{
  bool bVar1;
  path *ppVar2;
  ostream *poVar3;
  reference pvVar4;
  string *in_RDI;
  __type local_211;
  bool local_1f2;
  allocator<char> local_1cd;
  undefined4 local_1cc;
  reference local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *map;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  uint numberMaps;
  uint mapChoice;
  string_type local_160;
  byte local_13a;
  byte local_139;
  path local_138;
  string local_f8;
  directory_entry *local_d8;
  directory_entry *entry;
  undefined1 local_c0 [8];
  directory_iterator __end1;
  undefined1 local_a0 [8];
  directory_iterator __begin1;
  path local_80;
  directory_iterator local_40;
  directory_iterator *local_30;
  directory_iterator *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mapList;
  
  __range1 = (directory_iterator *)0x0;
  mapList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mapList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  std::experimental::filesystem::v1::current_path_abi_cxx11_((v1 *)&local_80);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            (&local_40,&local_80);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_80);
  local_30 = &local_40;
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)
             &__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,local_30);
  std::experimental::filesystem::v1::__cxx11::begin
            ((__cxx11 *)local_a0,
             (directory_iterator *)
             &__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)
             &__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&entry,local_30);
  std::experimental::filesystem::v1::__cxx11::end((directory_iterator *)local_c0);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&entry);
  while (bVar1 = std::experimental::filesystem::v1::__cxx11::operator!=
                           ((directory_iterator *)local_a0,(directory_iterator *)local_c0), bVar1) {
    local_d8 = (directory_entry *)
               std::experimental::filesystem::v1::__cxx11::directory_iterator::operator*
                         ((directory_iterator *)local_a0);
    ppVar2 = std::experimental::filesystem::v1::__cxx11::directory_entry::path(local_d8);
    local_139 = 0;
    local_13a = 0;
    bVar1 = std::experimental::filesystem::v1::__cxx11::path::has_extension(ppVar2);
    local_1f2 = false;
    if (bVar1) {
      ppVar2 = std::experimental::filesystem::v1::__cxx11::directory_entry::path(local_d8);
      std::experimental::filesystem::v1::__cxx11::path::extension(&local_138,ppVar2);
      local_139 = 1;
      std::experimental::filesystem::v1::__cxx11::path::string(&local_f8,&local_138);
      local_13a = 1;
      local_1f2 = std::operator==(&local_f8,".map");
    }
    if ((local_13a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_f8);
    }
    if ((local_139 & 1) != 0) {
      std::experimental::filesystem::v1::__cxx11::path::~path(&local_138);
    }
    if (local_1f2 != false) {
      ppVar2 = std::experimental::filesystem::v1::__cxx11::directory_entry::path(local_d8);
      std::experimental::filesystem::v1::__cxx11::path::filename((path *)&numberMaps,ppVar2);
      std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
                (&local_160,(path *)&numberMaps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::experimental::filesystem::v1::__cxx11::path::~path((path *)&numberMaps);
    }
    std::experimental::filesystem::v1::__cxx11::directory_iterator::operator++
              ((directory_iterator *)local_a0);
  }
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)local_c0);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)local_a0);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator(&local_40);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"",&local_1cd);
    std::allocator<char>::~allocator(&local_1cd);
  }
  else {
    do {
      std::operator<<((ostream *)&std::cout,"\nplease choose a map :\n");
      __range3._0_4_ = 0;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1);
      map = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&map), bVar1) {
        local_1c8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        __range3._0_4_ = (uint)__range3 + 1;
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(uint)__range3);
        poVar3 = std::operator<<(poVar3," - ");
        poVar3 = std::operator<<(poVar3,(string *)local_1c8);
        std::operator<<(poVar3,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::istream::operator>>((istream *)&std::cin,(uint *)((long)&__range3 + 4));
      std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
      std::istream::ignore((long)&std::cin,0x200);
      local_211 = true;
      if ((__range3._4_4_ != 0) && (local_211 = true, __range3._4_4_ <= (uint)__range3)) {
        local_211 = std::isnan<unsigned_int>(__range3._4_4_);
      }
    } while (local_211 != false);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1,(ulong)(__range3._4_4_ - 1));
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar4);
  }
  local_1cc = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  return in_RDI;
}

Assistant:

static std::string chooseMap() {
    vector<std::string> mapList = vector<std::string>();
    for (const auto& entry : fs::directory_iterator(fs::current_path())) {
        if (entry.path().has_extension() && entry.path().extension().string() == ".map") {
            mapList.push_back(entry.path().filename());
        }
    }
    if (!mapList.empty()) {
        unsigned int mapChoice;
        unsigned int numberMaps;
        do {
            cout << "\nplease choose a map :\n";
            numberMaps = 0;
            for (const auto& map : mapList) {
                numberMaps++;
                cout << numberMaps << " - " << map << "\n";
            }
            cin >> mapChoice;
            cin.clear();
            cin.ignore(512, '\n');
        } while (mapChoice < 1 || mapChoice > numberMaps || isnan(mapChoice));
        return std::string(mapList.at(mapChoice - 1));
    }
    return "";
}